

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O2

void __thiscall
sjtu::OrderManager::buy_ticket
          (OrderManager *this,UserManager *user_manager,TrainManager *train_manager,int argc,
          string *argv)

{
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *this_00;
  OrderManager *this_01;
  UserManager *this_02;
  bool bVar1;
  undefined7 extraout_var;
  orderType *order;
  ostream *poVar2;
  int iVar3;
  string *psVar4;
  long lVar5;
  allocator local_161;
  OrderManager *local_160;
  int local_154;
  ulong local_150;
  TrainManager *local_148;
  UserManager *local_140;
  timeType uday;
  string uname;
  string uto;
  string ufrom;
  string utrain;
  string local_a8;
  value_type local_88;
  string local_70;
  string local_50;
  
  uname._M_dataplus._M_p = (pointer)&uname.field_2;
  uname._M_string_length = 0;
  utrain._M_dataplus._M_p = (pointer)&utrain.field_2;
  utrain._M_string_length = 0;
  ufrom._M_dataplus._M_p = (pointer)&ufrom.field_2;
  ufrom._M_string_length = 0;
  uname.field_2._M_local_buf[0] = '\0';
  utrain.field_2._M_local_buf[0] = '\0';
  ufrom.field_2._M_local_buf[0] = '\0';
  uto._M_dataplus._M_p = (pointer)&uto.field_2;
  uto._M_string_length = 0;
  uto.field_2._M_local_buf[0] = '\0';
  uday.month = 0;
  uday.day = 0;
  uday.hour = 0;
  uday.minute = 0;
  local_150 = 0;
  local_160 = this;
  local_148 = train_manager;
  local_140 = user_manager;
  for (lVar5 = 0; lVar5 < argc; lVar5 = lVar5 + 2) {
    bVar1 = std::operator==(argv,"-u");
    psVar4 = &uname;
    if (bVar1) {
LAB_00106312:
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
    else {
      bVar1 = std::operator==(argv,"-i");
      psVar4 = &utrain;
      if (bVar1) goto LAB_00106312;
      bVar1 = std::operator==(argv,"-d");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_50,(string *)(argv + 1));
        timeType::timeType((timeType *)&local_88,&local_50);
        uday.minute = local_88.first._12_4_;
        uday.hour = local_88.first.second;
        uday.month = (undefined4)local_88.first.first;
        uday.day = local_88.first.first._4_4_;
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        bVar1 = std::operator==(argv,"-n");
        if (!bVar1) {
          bVar1 = std::operator==(argv,"-f");
          psVar4 = &ufrom;
          if (!bVar1) {
            bVar1 = std::operator==(argv,"-t");
            psVar4 = &uto;
            if (!bVar1) {
              bVar1 = std::operator==(argv,"-q");
              if (bVar1) {
                bVar1 = std::operator==(argv + 1,"true");
                local_150 = CONCAT71(extraout_var,bVar1);
              }
              goto LAB_0010631b;
            }
          }
          goto LAB_00106312;
        }
        local_154 = std::__cxx11::stoi(argv + 1,(size_t *)0x0,10);
      }
    }
LAB_0010631b:
    argv = argv + 2;
  }
  std::__cxx11::string::string((string *)&local_70,(string *)&uname);
  this_02 = local_140;
  bVar1 = UserManager::is_login(local_140,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (!bVar1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::endl<char,std::char_traits<char>>(poVar2);
    goto LAB_001065cc;
  }
  order = (orderType *)operator_new(0xb8);
  order->date[1].month = 0;
  order->date[1].day = 0;
  order->date[1].hour = 0;
  order->date[1].minute = 0;
  order->date[0].month = 0;
  order->date[0].day = 0;
  order->date[0].hour = 0;
  order->date[0].minute = 0;
  strcpy((char *)order,uname._M_dataplus._M_p);
  strcpy(order->trainID,utrain._M_dataplus._M_p);
  strcpy(order->station[0],ufrom._M_dataplus._M_p);
  strcpy(order->station[1],uto._M_dataplus._M_p);
  order->num = local_154;
  order->date[0].month = uday.month;
  order->date[0].day = uday.day;
  order->date[0].hour = uday.hour;
  order->date[0].minute = uday.minute;
  bVar1 = TrainManager::buy_ticket(local_148,order);
  iVar3 = -1;
  if (bVar1) {
    if (order->status == success) {
      UserManager::add_order(this_02,local_160,order);
      iVar3 = order->num * order->price;
      goto LAB_001065ab;
    }
    if ((local_150 & 1) == 0) goto LAB_001065ab;
    order->status = pending;
    UserManager::add_order(this_02,local_160,order);
    this_01 = local_160;
    this_00 = local_160->PendingBpTree;
    std::__cxx11::string::string((string *)&local_a8,order->trainID,&local_161);
    local_88.first.first = StringHasher::operator()((StringHasher *)this_01,&local_a8);
    local_88.first.second = this_01->pending_id + 1;
    this_01->pending_id = local_88.first.second;
    local_88.second = order->offset;
    BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
    ::insert(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    poVar2 = std::operator<<((ostream *)&std::cout,"queue");
  }
  else {
LAB_001065ab:
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  operator_delete(order,0xb8);
LAB_001065cc:
  std::__cxx11::string::~string((string *)&uto);
  std::__cxx11::string::~string((string *)&ufrom);
  std::__cxx11::string::~string((string *)&utrain);
  std::__cxx11::string::~string((string *)&uname);
  return;
}

Assistant:

void buy_ticket(UserManager *user_manager, TrainManager *train_manager, int argc, std::string *argv) {
            std::string uname, utrain, ufrom, uto;timeType uday;
            int unum;
            bool ifpending = false;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") uname = argv[i + 1];
                else if (argv[i] == "-i") utrain = argv[i + 1];
                else if (argv[i] == "-d") uday = timeType(argv[i + 1]);
                else if (argv[i] == "-n") unum = stoi(argv[i + 1]);
                else if (argv[i] == "-f") ufrom = argv[i + 1];
                else if (argv[i] == "-t") uto = argv[i + 1];
                else if (argv[i] == "-q") {
                    if (argv[i + 1] == "true") ifpending = true;
                    else ifpending = false;
                }
            }
            if (user_manager->is_login(uname) == false) std::cout << -1 << std::endl;
            else {
                orderType *tmp = new orderType;
                strcpy(tmp->username, uname.c_str());
                strcpy(tmp->trainID, utrain.c_str());
                strcpy(tmp->station[0], ufrom.c_str());
                strcpy(tmp->station[1], uto.c_str());
                tmp -> num = unum;
                tmp->date[0] = uday;
                if (train_manager->buy_ticket(tmp) == false) std::cout << -1 << std::endl;
                else {
                    if (tmp->status == success) {
                        user_manager->add_order(this, tmp);
                        std::cout << tmp->price * tmp->num << std::endl;
                    }
                    else {
                        if (ifpending == false) std::cout << -1 << std::endl;
                        else {
                            tmp->status = pending;
                            user_manager->add_order(this, tmp);
                            PendingBpTree->insert(std::make_pair(std::make_pair(hasher(tmp->trainID), ++ pending_id), tmp->offset));
                            std::cout << "queue" << std::endl;
                        }
                    }
                }
                delete tmp;
            }
        }